

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsparser.cc
# Opt level: O0

int ctemplate_htmlparser::jsparser_buffer_last_identifier(jsparser_ctx *js,char *identifier)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  int local_28;
  int local_24;
  int pos;
  int end;
  char *identifier_local;
  jsparser_ctx *js_local;
  
  if (identifier != (char *)0x0) {
    local_24 = -1;
    cVar2 = jsparser_buffer_get(js,-1);
    iVar3 = js_is_whitespace(cVar2);
    if (iVar3 != 0) {
      local_24 = -2;
    }
    local_28 = local_24;
    while( true ) {
      cVar2 = jsparser_buffer_get(js,local_28);
      iVar3 = js_is_identifier(cVar2);
      if (iVar3 == 0) break;
      local_28 = local_28 + -1;
    }
    bVar1 = local_28 + 1 < local_24;
    if (bVar1) {
      jsparser_buffer_slice(js,identifier,local_28 + 1,local_24);
    }
    else {
      *identifier = '\0';
    }
    js_local._4_4_ = (uint)bVar1;
    return js_local._4_4_;
  }
  __assert_fail("identifier != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/htmlparser/jsparser.cc"
                ,0x14c,
                "int ctemplate_htmlparser::jsparser_buffer_last_identifier(jsparser_ctx *, char *)")
  ;
}

Assistant:

int jsparser_buffer_last_identifier(jsparser_ctx *js, char *identifier)
{
  int end;
  int pos;

  assert(identifier != NULL);

  end = -1;
  /* Ignore the optional whitespace delimiter */
  if (js_is_whitespace(jsparser_buffer_get(js, -1))) {
    --end;
  }

  /* Find the beginning of the identifier. This loop ends either when we find a
   * character that doesn't belong to an identifier, or when we find a '\0'
   * character, which means we reached the end of the buffer. */
  for(pos = end; js_is_identifier(jsparser_buffer_get(js, pos)); --pos) {
  }
  if (pos + 1 >= end) {
    identifier[0] = '\0';
    return 0;
  }

  jsparser_buffer_slice(js, identifier, pos + 1, end);
  return 1;
}